

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O0

void CorUnix::InternalDeleteArray<unsigned_long>(unsigned_long *p)

{
  ulong local_28;
  size_t i;
  size_t cElements;
  size_t *pRealMem;
  unsigned_long *p_local;
  
  if (p != (unsigned_long *)0x0) {
    for (local_28 = 0; local_28 < p[-1]; local_28 = local_28 + 1) {
    }
    InternalFree(p + -1);
  }
  return;
}

Assistant:

void InternalDeleteArray(T *p)
    {
        if (p)
        {
            size_t *pRealMem = (size_t*)p - 1;
            size_t cElements = *pRealMem;
            for (size_t i = 0; i < cElements; i++)
                p[i].~T();
            InternalFree(pRealMem);
        }
    }